

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Valuator.cxx
# Opt level: O0

void __thiscall Fl_Valuator::Fl_Valuator(Fl_Valuator *this,int X,int Y,int W,int H,char *L)

{
  char *L_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Valuator *this_local;
  
  Fl_Widget::Fl_Widget(&this->super_Fl_Widget,X,Y,W,H,L);
  (this->super_Fl_Widget)._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Valuator_002edcc8;
  Fl_Widget::align(&this->super_Fl_Widget,2);
  Fl_Widget::when(&this->super_Fl_Widget,'\x01');
  this->value_ = 0.0;
  this->previous_value_ = 1.0;
  this->min = 0.0;
  this->max = 1.0;
  this->A = 0.0;
  this->B = 1;
  return;
}

Assistant:

Fl_Valuator::Fl_Valuator(int X, int Y, int W, int H, const char* L)
/**
  Creates a new Fl_Valuator widget using the given position,
  size, and label string. The default boxtype is FL_NO_BOX.
*/
: Fl_Widget(X,Y,W,H,L) {
  align(FL_ALIGN_BOTTOM);
  when(FL_WHEN_CHANGED);
  value_ = 0;
  previous_value_ = 1;
  min = 0;
  max = 1;
  A = 0.0;
  B = 1;
}